

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_obj(Am_Priority_List *this,Am_Object *obj)

{
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item *pAVar2;
  bool bVar3;
  Am_Priority_List_Item **ppAVar4;
  Am_Priority_List_Item *this_00;
  
  this_00 = this->head;
  if (this_00 != (Am_Priority_List_Item *)0x0) {
    do {
      bVar3 = Am_Object::operator==(&this_00->obj,obj);
      if (bVar3) {
        pAVar1 = this_00->prev;
        if (this->current == this_00) {
          this->current = pAVar1;
        }
        ppAVar4 = &pAVar1->next;
        if (pAVar1 == (Am_Priority_List_Item *)0x0) {
          ppAVar4 = &this->head;
        }
        pAVar2 = this_00->next;
        *ppAVar4 = pAVar2;
        ppAVar4 = &pAVar2->prev;
        if (pAVar2 == (Am_Priority_List_Item *)0x0) {
          ppAVar4 = &this->tail;
        }
        *ppAVar4 = pAVar1;
        return this_00;
      }
      this_00 = this_00->next;
    } while (this_00 != (Am_Priority_List_Item *)0x0);
  }
  return (Am_Priority_List_Item *)0x0;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_obj(Am_Object obj)
{
  Am_Priority_List_Item *p = head;
  for (; p != nullptr; p = p->next) {
    if (p->obj == obj)
      return this->take_out_item(p);
  }
  return nullptr;
}